

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateNewBlock
          (ReplaceDescArrayAccessUsingVarIndex *this)

{
  uint32_t res_id;
  BasicBlock *this_00;
  Instruction *pIVar1;
  IRContext *pIVar2;
  IRContext *this_01;
  DefUseManager *this_02;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  BasicBlock *local_18;
  BasicBlock *new_block;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  new_block = (BasicBlock *)this;
  this_00 = (BasicBlock *)operator_new(0x88);
  pIVar1 = (Instruction *)operator_new(0x70);
  pIVar2 = Pass::context(&this->super_Pass);
  this_01 = Pass::context(&this->super_Pass);
  res_id = IRContext::TakeNextId(this_01);
  memset(&local_38,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector(&local_38);
  Instruction::Instruction(pIVar1,pIVar2,OpLabel,0,res_id,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar1);
  BasicBlock::BasicBlock(this_00,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  local_18 = this_00;
  this_02 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar1 = BasicBlock::GetLabelInst(local_18);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,pIVar1);
  pIVar2 = Pass::context(&this->super_Pass);
  pIVar1 = BasicBlock::GetLabelInst(local_18);
  IRContext::set_instr_block(pIVar2,pIVar1,local_18);
  return local_18;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateNewBlock() const {
  auto* new_block = new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
      context(), spv::Op::OpLabel, 0, context()->TakeNextId(), {})));
  get_def_use_mgr()->AnalyzeInstDefUse(new_block->GetLabelInst());
  context()->set_instr_block(new_block->GetLabelInst(), new_block);
  return new_block;
}